

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58_tests.cpp
# Opt level: O0

void __thiscall
base58_tests::base58_random_encode_decode::test_method(base58_random_encode_decode *this)

{
  Span<const_unsigned_char> input;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  long in_FS_OFFSET;
  bool ok;
  bool ok_too_small;
  uint zeroes;
  uint len;
  int n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string encoded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  lazy_ostream *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  string *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  lazy_ostream *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd80;
  undefined2 in_stack_fffffffffffffd84;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 in_stack_fffffffffffffd87;
  lazy_ostream *in_stack_fffffffffffffd88;
  uint local_23c;
  undefined4 in_stack_fffffffffffffde0;
  int iVar4;
  const_string local_208 [2];
  lazy_ostream local_1e8 [3];
  const_string local_190 [2];
  lazy_ostream local_170 [2];
  assertion_result local_150;
  const_string local_118 [2];
  lazy_ostream local_f8 [2];
  assertion_result local_d8 [5];
  undefined1 local_59;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (iVar4 = 0; iVar4 < 1000; iVar4 = iVar4 + 1) {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      ((RandomMixin<FastRandomContext> *)
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                       (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
    iVar2 = (int)uVar3 + 1;
    bVar1 = RandomMixin<FastRandomContext>::randbool
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd38);
    if (bVar1) {
      local_23c = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                            ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd60,
                             in_stack_fffffffffffffd5c);
    }
    else {
      local_23c = 0;
    }
    local_59 = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
               (size_type)in_stack_fffffffffffffd60,
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)
               ,(allocator_type *)in_stack_fffffffffffffd50);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd88,
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))));
    Cat<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd70,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd38)
    ;
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)
               CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
    input.m_data._4_4_ = local_23c;
    input.m_data._0_4_ = in_stack_fffffffffffffde0;
    input.m_size._0_4_ = iVar2;
    input.m_size._4_4_ = iVar4;
    EncodeBase58Check_abi_cxx11_(input);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd38);
    RandomMixin<FastRandomContext>::randrange<unsigned_int>
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c
              );
    DecodeBase58Check(in_stack_fffffffffffffd60,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                      (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
    in_stack_fffffffffffffd80 = iVar2;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (pointer)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (unsigned_long)in_stack_fffffffffffffd38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd38);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd78,
                 (const_string *)in_stack_fffffffffffffd70,
                 CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                 (const_string *)in_stack_fffffffffffffd60);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (bool)in_stack_fffffffffffffd47);
      in_stack_fffffffffffffd88 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (pointer)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (unsigned_long)in_stack_fffffffffffffd38);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffd38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (pointer)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (unsigned_long)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd38 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_d8,local_f8,local_118,0x5e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd38);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd87 = boost::test_tools::tt_detail::dummy_cond();
      iVar2 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    } while ((bool)in_stack_fffffffffffffd87);
    RandomMixin<FastRandomContext>::randrange<unsigned_int>
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c
              );
    in_stack_fffffffffffffd86 =
         DecodeBase58Check(in_stack_fffffffffffffd60,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),iVar2);
    do {
      in_stack_fffffffffffffd78 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (pointer)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (unsigned_long)in_stack_fffffffffffffd38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd38);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd78,
                 (const_string *)in_stack_fffffffffffffd70,
                 CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                 (const_string *)in_stack_fffffffffffffd60);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (bool)in_stack_fffffffffffffd47);
      in_stack_fffffffffffffd70 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (pointer)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (unsigned_long)in_stack_fffffffffffffd38);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffd38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (pointer)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (unsigned_long)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd38 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_150,local_170,local_190,0x60,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd38);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd6f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffd6f);
    do {
      in_stack_fffffffffffffd60 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (pointer)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (unsigned_long)in_stack_fffffffffffffd38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd38);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd78,
                 (const_string *)in_stack_fffffffffffffd70,
                 CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                 (const_string *)in_stack_fffffffffffffd60);
      bVar1 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffffd60);
      in_stack_fffffffffffffd5c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd5c);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (bool)in_stack_fffffffffffffd47);
      in_stack_fffffffffffffd50 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (pointer)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (unsigned_long)in_stack_fffffffffffffd38);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffd38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 (pointer)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (unsigned_long)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd38 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)(local_1e8 + 2),local_1e8,local_208,0x61,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd38);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd4f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffd4f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    std::__cxx11::string::~string(in_stack_fffffffffffffd38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(base58_random_encode_decode)
{
    for (int n = 0; n < 1000; ++n) {
        unsigned int len = 1 + m_rng.randbits(8);
        unsigned int zeroes = m_rng.randbool() ? m_rng.randrange(len + 1) : 0;
        auto data = Cat(std::vector<unsigned char>(zeroes, '\000'), m_rng.randbytes(len - zeroes));
        auto encoded = EncodeBase58Check(data);
        std::vector<unsigned char> decoded;
        auto ok_too_small = DecodeBase58Check(encoded, decoded, m_rng.randrange(len));
        BOOST_CHECK(!ok_too_small);
        auto ok = DecodeBase58Check(encoded, decoded, len + m_rng.randrange(257 - len));
        BOOST_CHECK(ok);
        BOOST_CHECK(data == decoded);
    }
}